

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

void __thiscall
btHashedOverlappingPairCache::removeOverlappingPairsContainingProxy
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy,btDispatcher *dispatcher)

{
  RemovePairCallback removeCallback;
  undefined **local_10;
  btBroadphaseProxy *local_8;
  
  local_10 = &PTR__btOverlapCallback_00223418;
  local_8 = proxy;
  (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
    _vptr_btOverlappingPairCallback[0xc])(this,&local_10);
  return;
}

Assistant:

void	btHashedOverlappingPairCache::removeOverlappingPairsContainingProxy(btBroadphaseProxy* proxy,btDispatcher* dispatcher)
{

	class	RemovePairCallback : public btOverlapCallback
	{
		btBroadphaseProxy* m_obsoleteProxy;

	public:
		RemovePairCallback(btBroadphaseProxy* obsoleteProxy)
			:m_obsoleteProxy(obsoleteProxy)
		{
		}
		virtual	bool	processOverlap(btBroadphasePair& pair)
		{
			return ((pair.m_pProxy0 == m_obsoleteProxy) ||
				(pair.m_pProxy1 == m_obsoleteProxy));
		}
		
	};


	RemovePairCallback removeCallback(proxy);

	processAllOverlappingPairs(&removeCallback,dispatcher);
}